

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::ParamSpec::set_share_mode(ParamSpec *this,ParamSpec_DimCheckMode value)

{
  if (value < 2) {
    *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
    this->share_mode_ = value;
    return;
  }
  __assert_fail("::caffe::ParamSpec_DimCheckMode_IsValid(value)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/include/caffe/proto/caffe.pb.h"
                ,0x3875,"void caffe::ParamSpec::set_share_mode(::caffe::ParamSpec_DimCheckMode)");
}

Assistant:

bool ParamSpec_DimCheckMode_IsValid(int value) {
  switch (value) {
    case 0:
    case 1:
      return true;
    default:
      return false;
  }
}